

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::CopyPropagateArrays::IsAccessChainIndexValidAndEqualTo
          (CopyPropagateArrays *this,AccessChainEntry *entry,uint32_t value)

{
  IRContext *this_00;
  Constant *this_01;
  int iVar1;
  uint32_t uVar2;
  const_iterator cVar3;
  undefined4 extraout_var;
  bool bVar4;
  anon_union_4_2_642eeacd_for_AccessChainEntry_1 local_1c;
  
  if (entry->is_result_id == false) {
    uVar2 = (entry->field_1).result_id;
LAB_005880b1:
    bVar4 = uVar2 == value;
  }
  else {
    this_00 = (this->super_MemPass).super_Pass.context_;
    if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(this_00);
    }
    local_1c = entry->field_1;
    cVar3 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(((this_00->constant_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                     _M_head_impl)->id_to_const_val_)._M_h,&local_1c.result_id);
    if ((cVar3.
         super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
         ._M_cur != (__node_type *)0x0) &&
       (this_01 = *(Constant **)
                   ((long)cVar3.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                          ._M_cur + 0x10), this_01 != (Constant *)0x0)) {
      iVar1 = (*this_01->type_->_vptr_Type[10])();
      if (CONCAT44(extraout_var,iVar1) != 0) {
        uVar2 = analysis::Constant::GetU32(this_01);
        goto LAB_005880b1;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CopyPropagateArrays::IsAccessChainIndexValidAndEqualTo(
    const AccessChainEntry& entry, uint32_t value) const {
  if (!entry.is_result_id) {
    return entry.immediate == value;
  }

  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  const analysis::Constant* constant =
      const_mgr->FindDeclaredConstant(entry.result_id);
  if (!constant || !constant->type()->AsInteger()) {
    return false;
  }
  return constant->GetU32() == value;
}